

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgBinaryOps.cpp
# Opt level: O0

Expression * __thiscall
rsg::BinaryOp<8,_(rsg::Associativity)0>::createNextChild
          (BinaryOp<8,_(rsg::Associativity)0> *this,GeneratorState *state)

{
  ConstValueRangeAccess valueRange;
  ConstValueRangeAccess valueRange_00;
  GeneratorState *pGVar1;
  Expression *pEVar2;
  ValueRangeAccess local_88;
  VariableType *local_70;
  Scalar *local_68;
  Scalar *local_60;
  ValueRangeAccess local_58;
  VariableType *local_40;
  Scalar *local_38;
  Scalar *local_30;
  undefined4 local_28;
  undefined4 local_24;
  int rightPrec;
  int leftPrec;
  GeneratorState *state_local;
  BinaryOp<8,_(rsg::Associativity)0> *this_local;
  
  local_24 = 8;
  local_28 = 7;
  _rightPrec = state;
  state_local = (GeneratorState *)this;
  if (this->m_rightValueExpr == (Expression *)0x0) {
    GeneratorState::pushPrecedence(state,7);
    pGVar1 = _rightPrec;
    ValueRange::asAccess(&local_58,&this->m_rightValueRange);
    local_40 = local_58.super_ConstValueRangeAccess.m_type;
    local_38 = local_58.super_ConstValueRangeAccess.m_min;
    local_30 = local_58.super_ConstValueRangeAccess.m_max;
    valueRange.m_min = local_58.super_ConstValueRangeAccess.m_min;
    valueRange.m_type = local_58.super_ConstValueRangeAccess.m_type;
    valueRange.m_max = local_58.super_ConstValueRangeAccess.m_max;
    pEVar2 = Expression::createRandom(pGVar1,valueRange);
    this->m_rightValueExpr = pEVar2;
    GeneratorState::popPrecedence(_rightPrec);
    this_local = (BinaryOp<8,_(rsg::Associativity)0> *)this->m_rightValueExpr;
  }
  else if (this->m_leftValueExpr == (Expression *)0x0) {
    GeneratorState::pushPrecedence(state,8);
    pGVar1 = _rightPrec;
    ValueRange::asAccess(&local_88,&this->m_leftValueRange);
    local_70 = local_88.super_ConstValueRangeAccess.m_type;
    local_68 = local_88.super_ConstValueRangeAccess.m_min;
    local_60 = local_88.super_ConstValueRangeAccess.m_max;
    valueRange_00.m_min = local_88.super_ConstValueRangeAccess.m_min;
    valueRange_00.m_type = local_88.super_ConstValueRangeAccess.m_type;
    valueRange_00.m_max = local_88.super_ConstValueRangeAccess.m_max;
    pEVar2 = Expression::createRandom(pGVar1,valueRange_00);
    this->m_leftValueExpr = pEVar2;
    GeneratorState::popPrecedence(_rightPrec);
    this_local = (BinaryOp<8,_(rsg::Associativity)0> *)this->m_leftValueExpr;
  }
  else {
    this_local = (BinaryOp<8,_(rsg::Associativity)0> *)0x0;
  }
  return &this_local->super_Expression;
}

Assistant:

Expression* BinaryOp<Precedence, Assoc>::createNextChild (GeneratorState& state)
{
	int leftPrec	= Assoc == ASSOCIATIVITY_LEFT ? Precedence : Precedence-1;
	int rightPrec	= Assoc == ASSOCIATIVITY_LEFT ? Precedence-1 : Precedence;

	if (m_rightValueExpr == DE_NULL)
	{
		state.pushPrecedence(rightPrec);
		m_rightValueExpr = Expression::createRandom(state, m_rightValueRange.asAccess());
		state.popPrecedence();
		return m_rightValueExpr;
	}
	else if (m_leftValueExpr == DE_NULL)
	{
		state.pushPrecedence(leftPrec);
		m_leftValueExpr = Expression::createRandom(state, m_leftValueRange.asAccess());
		state.popPrecedence();
		return m_leftValueExpr;
	}
	else
		return DE_NULL;
}